

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O1

rt_function_error_t allocate_shift_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  long lVar4;
  rt_function_error_t rVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  rt_variable_getter p_Var9;
  rt_variable_setter p_Var10;
  void *pvVar11;
  code *pcVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  rt_list_t src;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t rVar18;
  
  rVar5 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 1) &&
     (rVar5 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    piVar8 = (int *)(*rt_malloc_func)(0x70);
    if (piVar8 == (int *)0x0) {
      rVar5 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      puVar2 = (undefined8 *)f->local_context;
      *puVar2 = piVar8;
      rVar18._4_4_ = 0;
      rVar18.size = ((*f->inputs)->shape).size;
      rVar18.data = ((*f->inputs)->shape).data;
      rVar18 = clone_list(rVar18);
      *piVar8 = rVar18.size;
      *(int **)(piVar8 + 2) = rVar18.data;
      src._4_4_ = 0;
      src.size = ((*f->outputs)->shape).size;
      src.data = ((*f->outputs)->shape).data;
      rVar18 = clone_list(src);
      piVar8[4] = rVar18.size;
      *(int **)(piVar8 + 6) = rVar18.data;
      shape._4_4_ = 0;
      shape.size = ((*f->inputs)->shape).size;
      shape.data = ((*f->inputs)->shape).data;
      rVar18 = calc_contiguous_strides(shape);
      piVar8[8] = rVar18.size;
      *(int **)(piVar8 + 10) = rVar18.data;
      rVar18 = allocate_list(piVar8[4]);
      piVar8[0xc] = rVar18.size;
      *(int **)(piVar8 + 0xe) = rVar18.data;
      prVar3 = *f->inputs;
      *(rt_variable_t **)(piVar8 + 0x12) = prVar3;
      p_Var9 = select_getter(prVar3);
      *(rt_variable_getter *)(piVar8 + 0x14) = p_Var9;
      prVar3 = *f->outputs;
      *(rt_variable_t **)(piVar8 + 0x16) = prVar3;
      p_Var10 = select_setter(prVar3);
      *(rt_variable_setter *)(piVar8 + 0x18) = p_Var10;
      shape_00._4_4_ = 0;
      shape_00.size = **(uint **)(piVar8 + 0x16);
      shape_00.data = *(int **)(*(uint **)(piVar8 + 0x16) + 2);
      iVar6 = calc_shape_size(shape_00);
      piVar8[0x1a] = iVar6;
      pvVar11 = (*rt_malloc_func)((long)*piVar8 << 3);
      *(void **)(piVar8 + 0x10) = pvVar11;
      if (0 < *piVar8) {
        lVar15 = 0;
        do {
          iVar6 = *(int *)(*(long *)(piVar8 + 10) + lVar15 * 4);
          uVar1 = *(uint *)(*(long *)(piVar8 + 2) + lVar15 * 4);
          pvVar11 = (*rt_malloc_func)((long)(int)uVar1 * 4);
          *(void **)(*(long *)(piVar8 + 0x10) + lVar15 * 8) = pvVar11;
          uVar13 = (int)lVar15 + (*(int *)(puVar2 + 1) - *piVar8);
          iVar7 = 0;
          if (-1 < (int)uVar13) {
            iVar7 = -*(int *)(puVar2[2] + (ulong)uVar13 * 4);
          }
          if (*(int *)(puVar2 + 3) == 1) {
            if (0 < (int)uVar1) {
              lVar4 = *(long *)(*(long *)(piVar8 + 0x10) + lVar15 * 8);
              uVar17 = 0;
              do {
                uVar13 = 0;
                if (uVar1 != 1) {
                  uVar14 = iVar7 + uVar1 * 2 + (int)uVar17;
                  uVar13 = -uVar14;
                  if (0 < (int)uVar14) {
                    uVar13 = uVar14;
                  }
                  uVar13 = uVar13 % (uVar1 * 2);
                }
                uVar14 = ~uVar13 + uVar1 * 2;
                if ((int)uVar13 < (int)uVar1) {
                  uVar14 = uVar13;
                }
                *(uint *)(lVar4 + uVar17 * 4) = uVar14 * iVar6;
                uVar17 = uVar17 + 1;
              } while (uVar1 != uVar17);
            }
          }
          else if (0 < (int)uVar1) {
            lVar4 = *(long *)(*(long *)(piVar8 + 0x10) + lVar15 * 8);
            uVar17 = 0;
            do {
              iVar16 = iVar7 + (int)uVar17;
              if (iVar16 < 1) {
                iVar16 = 0;
              }
              if ((int)(uVar1 - 1) <= iVar16) {
                iVar16 = uVar1 - 1;
              }
              *(int *)(lVar4 + uVar17 * 4) = iVar16 * iVar6;
              uVar17 = uVar17 + 1;
            } while (uVar1 != uVar17);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *piVar8);
      }
      if (((*(byte *)(*(long *)(piVar8 + 0x12) + 0x10) & 0xf) == 0) &&
         ((*(byte *)(*(long *)(piVar8 + 0x16) + 0x10) & 0xf) == 0)) {
        pcVar12 = exec_shift;
      }
      else {
        pcVar12 = exec_shift_generic;
      }
      f->exec_func = pcVar12;
      rVar5 = RT_FUNCTION_ERROR_NOERROR;
    }
  }
  return rVar5;
}

Assistant:

rt_function_error_t allocate_shift_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  shift_private_t *p = rt_malloc_func(sizeof(shift_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  shift_local_context_t *context = (shift_local_context_t *)(f->local_context);
  ((shift_local_context_t *)(f->local_context))->data = (void *)p;
  p->input_shape = clone_list(f->inputs[0]->shape);
  p->output_shape = clone_list(f->outputs[0]->shape);
  p->input_strides = calc_contiguous_strides(f->inputs[0]->shape);
  p->out_position = allocate_list(p->output_shape.size);
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(p->output->shape);

  p->table = rt_malloc_func(sizeof(int *) * p->input_shape.size);

  for (int i = 0; i < p->input_shape.size; i++) {
    const int stride = p->input_strides.data[i];
    const int size = p->input_shape.data[i];
    p->table[i] = rt_malloc_func(size * sizeof(int));
    const int shift_index = context->shifts.size - p->input_shape.size + i;
    const int shift = shift_index >= 0 ? -context->shifts.data[shift_index] : 0;

    if (context->border_mode == SHIFT_BORDER_MODE_REFLECT) {
      for (int j = 0; j < size; j++) {
        const int a = size > 1 ? (abs(j + size * 2 + shift) % (size * 2)) : 0;
        p->table[i][j] = (a >= size ? (size * 2) - 1 - a : a) * stride;
      }
    } else {
      for (int j = 0; j < size; j++) {
        p->table[i][j] = MIN(MAX(j + shift, 0), size - 1) * stride;
      }
    }
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_SHIFT_FLOAT32
    f->exec_func = exec_shift;
#endif /* CONFIG_SHIFT_FLOAT32 */
  } else {
#ifdef CONFIG_SHIFT_GENERIC
    f->exec_func = exec_shift_generic;
#endif /* CONFIG_SHIFT_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}